

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_MeshParameters::SetFaceType(ON_MeshParameters *this,uint face_type)

{
  undefined8 uVar1;
  
  if (((face_type < 0x100) && ((int)face_type < 3)) && (this->m_face_type != face_type)) {
    *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_geometry_settings_hash).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar1;
    this->m_face_type = (uchar)face_type;
  }
  return;
}

Assistant:

void ON_MeshParameters::Internal_SetCharHelper(unsigned int u, unsigned char minc, unsigned char maxc, unsigned char* dest)
{
  if (u > 255)
    return;
  const unsigned char c = (unsigned char)u;
  if (c >= minc && c <= maxc && c != *dest)
  {
    m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;
    *dest = c;
  }
}